

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ir-builder.cpp
# Opt level: O0

Result<wasm::Ok> * __thiscall
wasm::IRBuilder::makeResume
          (Result<wasm::Ok> *__return_storage_ptr__,IRBuilder *this,HeapType ct,
          vector<wasm::Name,_std::allocator<wasm::Name>_> *tags,
          vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels
          )

{
  vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *pvVar1;
  bool bVar2;
  size_type sVar3;
  size_type sVar4;
  size_t size;
  Err *pEVar5;
  ResumeTable *handlerBlocks;
  ResumeTable *pRVar6;
  Resume *expr;
  optional<wasm::HeapType> ct_00;
  Ok local_2f1;
  Err local_2f0;
  Err *local_2d0;
  Err *err_2;
  undefined1 local_2c0 [8];
  Result<wasm::Ok> _val_2;
  Err *err_1;
  undefined1 local_268;
  undefined3 uStack_267;
  ChildPopper local_260;
  undefined1 local_258 [8];
  Result<wasm::Ok> _val_1;
  Err local_228;
  Err *local_208;
  Err *err;
  Result<wasm::ResumeTable> _val;
  function<wasm::Result<wasm::Type>_(unsigned_int)> local_1c0;
  anon_class_8_1_8991fb9c local_1a0;
  function<wasm::Result<wasm::Name>_(unsigned_int)> local_198;
  undefined1 local_178 [8];
  Result<wasm::ResumeTable> resumetable;
  undefined1 local_138 [8];
  Signature contSig;
  Resume curr;
  Err local_88;
  allocator<char> local_51;
  Err local_50;
  vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *local_30;
  vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_> *labels_local;
  vector<wasm::Name,_std::allocator<wasm::Name>_> *tags_local;
  IRBuilder *this_local;
  HeapType ct_local;
  
  local_30 = labels;
  labels_local = (vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>
                  *)tags;
  tags_local = (vector<wasm::Name,_std::allocator<wasm::Name>_> *)this;
  this_local = (IRBuilder *)ct.id;
  ct_local.id = (uintptr_t)__return_storage_ptr__;
  sVar3 = std::vector<wasm::Name,_std::allocator<wasm::Name>_>::size(tags);
  sVar4 = std::vector<std::optional<unsigned_int>,_std::allocator<std::optional<unsigned_int>_>_>::
          size(local_30);
  if (sVar3 == sVar4) {
    bVar2 = HeapType::isContinuation((HeapType *)&this_local);
    if (bVar2) {
      Resume::Resume((Resume *)&contSig.results,&this->wasm->allocator);
      resumetable.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ =
           HeapType::getContinuation((HeapType *)&this_local);
      _local_138 = HeapType::getSignature
                             ((HeapType *)
                              ((long)&resumetable.val.
                                      super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                                      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                                      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
      size = wasm::Type::size((Type *)local_138);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::resize
                ((ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
                 &curr.handlerBlocks.allocator,size);
      pvVar1 = local_30;
      local_1a0.this = this;
      std::function<wasm::Result<wasm::Name>(unsigned_int)>::
      function<wasm::IRBuilder::makeResume(wasm::HeapType,std::vector<wasm::Name,std::allocator<wasm::Name>>const&,std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>const&)::__0,void>
                ((function<wasm::Result<wasm::Name>(unsigned_int)> *)&local_198,&local_1a0);
      _val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
      super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
      super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err>.
      super__Variant_storage_alias<wasm::ResumeTable,_wasm::Err>._48_8_ = this;
      std::function<wasm::Result<wasm::Type>(unsigned_int)>::
      function<wasm::IRBuilder::makeResume(wasm::HeapType,std::vector<wasm::Name,std::allocator<wasm::Name>>const&,std::vector<std::optional<unsigned_int>,std::allocator<std::optional<unsigned_int>>>const&)::__1,void>
                ((function<wasm::Result<wasm::Type>(unsigned_int)> *)&local_1c0,
                 (anon_class_8_1_8991fb9c *)
                 ((long)&_val.val.super__Variant_base<wasm::ResumeTable,_wasm::Err>.
                         super__Move_assign_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Copy_assign_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Move_ctor_alias<wasm::ResumeTable,_wasm::Err>.
                         super__Copy_ctor_alias<wasm::ResumeTable,_wasm::Err> + 0x30));
      makeResumeTable((Result<wasm::ResumeTable> *)local_178,pvVar1,&local_198,&local_1c0);
      std::function<wasm::Result<wasm::Type>_(unsigned_int)>::~function(&local_1c0);
      std::function<wasm::Result<wasm::Name>_(unsigned_int)>::~function(&local_198);
      Result<wasm::ResumeTable>::Result
                ((Result<wasm::ResumeTable> *)&err,(Result<wasm::ResumeTable> *)local_178);
      local_208 = Result<wasm::ResumeTable>::getErr((Result<wasm::ResumeTable> *)&err);
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = local_208 != (Err *)0x0;
      if ((bool)_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
                super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_) {
        wasm::Err::Err(&local_228,local_208);
        Result<wasm::Ok>::Result(__return_storage_ptr__,&local_228);
        wasm::Err::~Err(&local_228);
      }
      _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
      super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
      super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
      super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
      Result<wasm::ResumeTable>::~Result((Result<wasm::ResumeTable> *)&err);
      if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
        ChildPopper::ChildPopper(&local_260,this);
        std::optional<wasm::HeapType>::optional<wasm::HeapType_&,_true>
                  ((optional<wasm::HeapType> *)&err_1,(HeapType *)&this_local);
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._12_4_ = 0;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_payload =
             (_Storage<wasm::HeapType,_true>)err_1;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._M_engaged = (bool)local_268;
        ct_00.super__Optional_base<wasm::HeapType,_true,_true>._M_payload.
        super__Optional_payload_base<wasm::HeapType>._9_3_ = uStack_267;
        ChildPopper::visitResume
                  ((Result<wasm::Ok> *)local_258,&local_260,(Resume *)&contSig.results,ct_00);
        pEVar5 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_258);
        if (pEVar5 != (Err *)0x0) {
          wasm::Err::Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                        super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                        super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20),pEVar5);
          Result<wasm::Ok>::Result
                    (__return_storage_ptr__,
                     (Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                    super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                    super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                    super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
          wasm::Err::~Err((Err *)((long)&_val_2.val.super__Variant_base<wasm::Ok,_wasm::Err>.
                                         super__Move_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
                                         super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
                                         super__Copy_ctor_alias<wasm::Ok,_wasm::Err> + 0x20));
        }
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
        _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
        super__Move_assign_alias<wasm::Ok,_wasm::Err>.super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
        super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
        super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = pEVar5 != (Err *)0x0;
        Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_258);
        if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
          err_2 = (Err *)this_local;
          anon_unknown_282::validateTypeAnnotation
                    ((Result<wasm::Ok> *)local_2c0,(HeapType)this_local,
                     (Expression *)curr.operands.allocator);
          local_2d0 = Result<wasm::Ok>::getErr((Result<wasm::Ok> *)local_2c0);
          bVar2 = local_2d0 != (Err *)0x0;
          if (bVar2) {
            wasm::Err::Err(&local_2f0,local_2d0);
            Result<wasm::Ok>::Result(__return_storage_ptr__,&local_2f0);
            wasm::Err::~Err(&local_2f0);
          }
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._37_3_ = 0;
          _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
          super__Move_assign_alias<wasm::Ok,_wasm::Err>.
          super__Copy_assign_alias<wasm::Ok,_wasm::Err>.super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
          super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_1_ = bVar2;
          Result<wasm::Ok>::~Result((Result<wasm::Ok> *)local_2c0);
          pvVar1 = labels_local;
          if (_val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
              super__Move_assign_alias<wasm::Ok,_wasm::Err>.
              super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
              super__Move_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
              super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ == 0) {
            handlerBlocks =
                 Result<wasm::ResumeTable>::operator->((Result<wasm::ResumeTable> *)local_178);
            pRVar6 = Result<wasm::ResumeTable>::operator->((Result<wasm::ResumeTable> *)local_178);
            expr = Builder::makeResume(&this->builder,
                                       (vector<wasm::Name,_std::allocator<wasm::Name>_> *)pvVar1,
                                       &handlerBlocks->targets,&pRVar6->sentTypes,
                                       (ExpressionList *)&curr.handlerBlocks.allocator,
                                       (Expression *)curr.operands.allocator);
            push(this,(Expression *)expr);
            Result<wasm::Ok>::Result<wasm::Ok>(__return_storage_ptr__,&local_2f1);
            _val_1.val.super__Variant_base<wasm::Ok,_wasm::Err>.
            super__Move_assign_alias<wasm::Ok,_wasm::Err>.
            super__Copy_assign_alias<wasm::Ok,_wasm::Err>.
            super__Move_ctor_alias<wasm::Ok,_wasm::Err>.super__Copy_ctor_alias<wasm::Ok,_wasm::Err>.
            super__Variant_storage_alias<wasm::Ok,_wasm::Err>._36_4_ = 1;
          }
        }
      }
      Result<wasm::ResumeTable>::~Result((Result<wasm::ResumeTable> *)local_178);
    }
    else {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_88,"expected continuation type",
                 (allocator<char> *)((long)&curr.sentTypes.allocator + 7));
      Result<wasm::Ok>::Result(__return_storage_ptr__,&local_88);
      wasm::Err::~Err(&local_88);
      std::allocator<char>::~allocator((allocator<char> *)((long)&curr.sentTypes.allocator + 7));
    }
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"the sizes of tags and labels must be equal",&local_51);
    Result<wasm::Ok>::Result(__return_storage_ptr__,&local_50);
    wasm::Err::~Err(&local_50);
    std::allocator<char>::~allocator(&local_51);
  }
  return __return_storage_ptr__;
}

Assistant:

Result<>
IRBuilder::makeResume(HeapType ct,
                      const std::vector<Name>& tags,
                      const std::vector<std::optional<Index>>& labels) {
  if (tags.size() != labels.size()) {
    return Err{"the sizes of tags and labels must be equal"};
  }
  if (!ct.isContinuation()) {
    return Err{"expected continuation type"};
  }

  Resume curr(wasm.allocator);
  auto contSig = ct.getContinuation().type.getSignature();
  curr.operands.resize(contSig.params.size());

  Result<ResumeTable> resumetable = makeResumeTable(
    labels,
    [this](Index i) { return this->getLabelName(i); },
    [this](Index i) { return this->getLabelType(i); });
  CHECK_ERR(resumetable);
  CHECK_ERR(ChildPopper{*this}.visitResume(&curr, ct));
  CHECK_ERR(validateTypeAnnotation(ct, curr.cont));

  push(builder.makeResume(tags,
                          resumetable->targets,
                          resumetable->sentTypes,
                          std::move(curr.operands),
                          curr.cont));

  return Ok{};
}